

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderFramebufferTextureInvalidLevelNumber::deinit
          (GeometryShaderFramebufferTextureInvalidLevelNumber *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
    (**(code **)(lVar2 + 0x78))(0x8d40,0);
  }
  if (this->m_texels != (GLubyte *)0x0) {
    operator_delete__(this->m_texels);
    this->m_texels = (GLubyte *)0x0;
  }
  if (this->m_to_2d_array_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_2d_array_id);
    this->m_to_2d_array_id = 0;
  }
  if (this->m_to_3d_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_3d_id);
    this->m_to_3d_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderFramebufferTextureInvalidLevelNumber::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);
		m_fbo_id = 0;

		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	}

	if (m_texels != NULL)
	{
		delete[] m_texels;
		m_texels = NULL;
	}

	if (m_to_2d_array_id != 0)
	{
		gl.deleteTextures(1, &m_to_2d_array_id);
		m_to_2d_array_id = 0;
	}

	if (m_to_3d_id != 0)
	{
		gl.deleteTextures(1, &m_to_3d_id);
		m_to_3d_id = 0;
	}

	/* Release base class */
	TestCaseBase::deinit();
}